

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  byte bVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiTableSettings *pIVar4;
  long lVar5;
  int column_n;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  
  pIVar3 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      pIVar4 = TableSettingsFindByID(table->ID);
      if (pIVar4 == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)pIVar4->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      table->SettingsOffset = (int)pIVar4 - *(int *)&(pIVar3->SettingsTables).Buf.Data;
    }
    else {
      pIVar4 = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = pIVar4->SaveFlags;
    table->RefScale = pIVar4->RefScale;
    pbVar8 = (byte *)((long)&pIVar4[1].RefScale + 3);
    uVar7 = 0;
    for (iVar10 = 0; bVar1 = pIVar4->ColumnsCount, iVar10 < (char)bVar1; iVar10 = iVar10 + 1) {
      uVar12 = (uint)(char)pbVar8[-3];
      uVar9 = (ulong)uVar12;
      if ((-1 < (int)uVar12) && ((int)uVar12 < table->ColumnsCount)) {
        pIVar2 = (table->Columns).Data;
        uVar13 = pIVar4->SaveFlags;
        if ((uVar13 & 1) != 0) {
          *(undefined4 *)((long)&pIVar2[(int)uVar12].WidthRequest + (ulong)(*pbVar8 & 8)) =
               *(undefined4 *)(pbVar8 + -0xb);
          pIVar2[(int)uVar12].AutoFitQueue = '\0';
          uVar13 = pIVar4->SaveFlags;
        }
        if ((uVar13 & 2) != 0) {
          uVar9 = (ulong)pbVar8[-2];
        }
        pIVar2[(int)uVar12].DisplayOrder = (ImGuiTableColumnIdx)uVar9;
        uVar7 = uVar7 | 1L << (uVar9 & 0x3f);
        bVar11 = (bool)(*pbVar8 >> 2 & 1);
        pIVar2[(int)uVar12].IsUserEnabledNextFrame = bVar11;
        pIVar2[(int)uVar12].IsUserEnabled = bVar11;
        pIVar2[(int)uVar12].SortOrder = pbVar8[-1];
        pIVar2[(int)uVar12].field_0x65 = pIVar2[(int)uVar12].field_0x65 & 0xfc | *pbVar8 & 3;
      }
      pbVar8 = pbVar8 + 0xc;
    }
    uVar9 = ~(-1L << (bVar1 & 0x3f));
    if (bVar1 == 0x40) {
      uVar9 = 0xffffffffffffffff;
    }
    if (uVar7 != uVar9) {
      lVar5 = 0x52;
      for (lVar6 = 0; lVar6 < table->ColumnsCount; lVar6 = lVar6 + 1) {
        *(char *)((long)&((table->Columns).Data)->Flags + lVar5) = (char)lVar6;
        lVar5 = lVar5 + 0x68;
      }
    }
    lVar5 = 0x52;
    for (lVar6 = 0; lVar6 < table->ColumnsCount; lVar6 = lVar6 + 1) {
      (table->DisplayOrderToIndex).Data[*(char *)((long)&((table->Columns).Data)->Flags + lVar5)] =
           (char)lVar6;
      lVar5 = lVar5 + 0x68;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}